

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O2

int nn_xrep_recv(nn_sockbase *self,nn_msg *msg)

{
  nn_chunkref *self_00;
  size_t size;
  FILE *__stream;
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  void *pvVar4;
  size_t sVar5;
  void *pvVar6;
  uint8_t *buf;
  char *pcVar7;
  int maxttl;
  size_t sz;
  nn_pipe *pipe;
  nn_chunkref ref;
  
  uVar1 = nn_fq_recv((nn_fq *)&self[2].sock,msg,&pipe);
  if (-1 < (int)uVar1) {
    if ((uVar1 & 2) == 0) {
      sz = 4;
      iVar2 = nn_sockbase_getopt(self,0x11,&maxttl,&sz);
      if (iVar2 != 0) {
        nn_backtrace_print();
        __stream = _stderr;
        pcVar7 = nn_err_strerror(-iVar2);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar7,(ulong)(uint)-iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/xrep.c"
                ,0xd5);
LAB_00118b99:
        fflush(_stderr);
        nn_err_abort();
      }
      self_00 = &msg->body;
      pvVar4 = nn_chunkref_data(self_00);
      sz = nn_chunkref_size(self_00);
      iVar2 = -1;
      sVar5 = 0;
      do {
        size = sVar5 + 4;
        if (sz < size) goto LAB_00118b0b;
        uVar3 = nn_getl((uint8_t *)(sVar5 + (long)pvVar4));
        iVar2 = iVar2 + 1;
        sVar5 = size;
      } while (-1 < (int)uVar3);
      if (maxttl <= iVar2) {
LAB_00118b0b:
        nn_msg_term(msg);
        return -0xb;
      }
      sVar5 = nn_chunkref_size(&msg->sphdr);
      if (sVar5 != 0) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/xrep.c"
                ,0xf2);
        goto LAB_00118b99;
      }
      nn_chunkref_term(&msg->sphdr);
      nn_chunkref_init(&msg->sphdr,size);
      pvVar6 = nn_chunkref_data(&msg->sphdr);
      memcpy(pvVar6,pvVar4,size);
      nn_chunkref_trim(self_00,size);
    }
    pvVar4 = nn_pipe_getdata(pipe);
    sVar5 = nn_chunkref_size(&msg->sphdr);
    nn_chunkref_init(&ref,sVar5 + 4);
    buf = (uint8_t *)nn_chunkref_data(&ref);
    nn_putl(buf,*(uint32_t *)((long)pvVar4 + 8));
    pvVar4 = nn_chunkref_data(&ref);
    pvVar6 = nn_chunkref_data(&msg->sphdr);
    sVar5 = nn_chunkref_size(&msg->sphdr);
    memcpy((void *)((long)pvVar4 + 4),pvVar6,sVar5);
    nn_chunkref_term(&msg->sphdr);
    nn_chunkref_mv(&msg->sphdr,&ref);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

int nn_xrep_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xrep *xrep;
    struct nn_pipe *pipe;
    int i;
    int maxttl;
    void *data;
    size_t sz;
    struct nn_chunkref ref;
    struct nn_xrep_data *pipedata;

    xrep = nn_cont (self, struct nn_xrep, sockbase);

    rc = nn_fq_recv (&xrep->inpipes, msg, &pipe);
    if (nn_slow (rc < 0))
        return rc;

    if (!(rc & NN_PIPE_PARSED)) {

        sz = sizeof (maxttl);
        rc = nn_sockbase_getopt (self, NN_MAXTTL, &maxttl, &sz);
        errnum_assert (rc == 0, -rc);

        /*  Determine the size of the message header. */
        data = nn_chunkref_data (&msg->body);
        sz = nn_chunkref_size (&msg->body);
        i = 0;
        while (1) {

            /*  Ignore the malformed requests without the bottom of the stack. */
            if (nn_slow ((i + 1) * sizeof (uint32_t) > sz)) {
                nn_msg_term (msg);
                return -EAGAIN;
            }

            /*  If the bottom of the backtrace stack is reached, proceed. */
            if (nn_getl ((uint8_t*)(((uint32_t*) data) + i)) & 0x80000000)
                break;

            ++i;
        }
        ++i;

        /* If we encountered too many hops, just toss the message */
        if (i > maxttl) {
            nn_msg_term (msg);
            return -EAGAIN;
        }

        /*  Split the header and the body. */
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, i * sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), data, i * sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, i * sizeof (uint32_t));
    }

    /*  Prepend the header by the pipe key. */
    pipedata = nn_pipe_getdata (pipe);
    nn_chunkref_init (&ref,
        nn_chunkref_size (&msg->sphdr) + sizeof (uint32_t));
    nn_putl (nn_chunkref_data (&ref), pipedata->outitem.key);
    memcpy (((uint8_t*) nn_chunkref_data (&ref)) + sizeof (uint32_t),
        nn_chunkref_data (&msg->sphdr), nn_chunkref_size (&msg->sphdr));
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &ref);

    return 0;
}